

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateByteSize
          (MessageGenerator *this,Printer *printer)

{
  Options *options;
  vector<int,_std::allocator<int>_> *fields;
  FieldDescriptor FVar1;
  pointer ppFVar2;
  cpp *this_00;
  FieldDescriptor *field;
  long lVar3;
  pointer pvVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint32_t n;
  uint uVar8;
  FieldGenerator *pFVar9;
  __normal_iterator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_*,_std::vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  __first;
  LogMessage *pLVar10;
  string *from;
  ulong uVar11;
  long lVar12;
  int cached_has_word_index_00;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field_00;
  vector<int,_std::allocator<int>_> *has_bit_indices;
  AlphaNum *a;
  ulong uVar13;
  char *format_00;
  Descriptor *descriptor;
  ColdChunkSkipper *this_01;
  Printer *in_R8;
  size_type in_R9;
  pointer ppFVar14;
  Printer *printer_00;
  anon_unknown_0 *this_02;
  FieldDescriptor *pFVar15;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Hex hex;
  StringPiece has_bits_var;
  int cached_has_word_index;
  Printer *local_1e0;
  undefined4 local_1d4;
  Formatter format;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  Iterator __begin4;
  string chunk_mask_str;
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks_for_has_bits;
  Iterator __end3;
  ColdChunkSkipper cold_skipper;
  Iterator __end4;
  bool local_70 [8];
  Printer *local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  
  options = &this->options_;
  bVar5 = HasSimpleBaseClass(this->descriptor_,options);
  if (!bVar5) {
    format.printer_ = printer;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
    if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x48) == '\x01') {
      cold_skipper.cold_threshold_ = (double)&cold_skipper.has_bit_indices_;
      cold_skipper.has_bit_indices_._0_4_ = 0;
      cold_skipper.access_info_map_ = (AccessInfoMap *)0x0;
      cold_skipper.variables_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      cold_skipper.variables_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      cold_skipper.variables_._M_t._M_impl._0_8_ = cold_skipper.cold_threshold_;
      SetUnknownFieldsVariable
                (this->descriptor_,options,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&cold_skipper);
      Formatter::AddMap(&format,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&cold_skipper);
      Formatter::operator()<>
                (&format,
                 "size_t $classname$::ByteSizeLong() const {\n$annotate_bytesize$// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n  size_t total_size = _extensions_.MessageSetByteSize();\n  if ($have_unknown_fields$) {\n    total_size += ::$proto_ns$::internal::\n        ComputeUnknownMessageSetItemsSize($unknown_fields$);\n  }\n  int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\n  SetCachedSize(cached_size);\n  return total_size;\n}\n"
                );
      this_01 = &cold_skipper;
    }
    else {
      local_1e0 = printer;
      if (1 < this->num_required_fields_) {
        Formatter::operator()<>
                  (&format,
                   "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n// @@protoc_insertion_point(required_fields_byte_size_fallback_start:$full_name$)\n"
                  );
        io::Printer::Indent(format.printer_);
        Formatter::operator()<>(&format,"size_t total_size = 0;\n");
        ppFVar2 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pFVar15 = extraout_RDX;
        for (ppFVar14 = (this->optimized_order_).
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppFVar14 != ppFVar2;
            ppFVar14 = ppFVar14 + 1) {
          this_00 = (cpp *)*ppFVar14;
          if (((byte)this_00[1] & 0x60) == 0x40) {
            FieldName_abi_cxx11_((string *)&cold_skipper,this_00,pFVar15);
            Formatter::operator()
                      (&format,"\nif (_internal_has_$1$()) {\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cold_skipper);
            std::__cxx11::string::~string((string *)&cold_skipper);
            io::Printer::Indent(format.printer_);
            PrintFieldComment<google::protobuf::FieldDescriptor>(&format,(FieldDescriptor *)this_00)
            ;
            pFVar9 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)this_00);
            (*pFVar9->_vptr_FieldGenerator[0x14])(pFVar9,local_1e0);
            io::Printer::Outdent(format.printer_);
            Formatter::operator()<>(&format,"}\n");
            pFVar15 = extraout_RDX_00;
          }
        }
        Formatter::operator()<>(&format,"\nreturn total_size;\n");
        io::Printer::Outdent(format.printer_);
        Formatter::operator()<>(&format,"}\n");
      }
      Formatter::operator()<>
                (&format,
                 "size_t $classname$::ByteSizeLong() const {\n$annotate_bytesize$// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n"
                );
      io::Printer::Indent(format.printer_);
      Formatter::operator()<>(&format,"size_t total_size = 0;\n\n");
      descriptor = this->descriptor_;
      if (0 < *(int *)(descriptor + 0x78)) {
        Formatter::operator()<>(&format,"total_size += _extensions_.ByteSize();\n\n");
        descriptor = this->descriptor_;
      }
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &vars._M_t._M_impl.super__Rb_tree_header._M_header;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      SetUnknownFieldsVariable(descriptor,options,&vars);
      Formatter::AddMap(&format,&vars);
      if (this->num_required_fields_ < 2) {
        ppFVar2 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppFVar14 = (this->optimized_order_).
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppFVar14 != ppFVar2;
            ppFVar14 = ppFVar14 + 1) {
          pFVar15 = *ppFVar14;
          if (((byte)pFVar15[1] & 0x60) == 0x40) {
            PrintFieldComment<google::protobuf::FieldDescriptor>(&format,pFVar15);
            FieldName_abi_cxx11_((string *)&cold_skipper,(cpp *)pFVar15,field_00);
            Formatter::operator()
                      (&format,"if (_internal_has_$1$()) {\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cold_skipper);
            std::__cxx11::string::~string((string *)&cold_skipper);
            io::Printer::Indent(format.printer_);
            pFVar9 = FieldGeneratorMap::get(&this->field_generators_,pFVar15);
            (*pFVar9->_vptr_FieldGenerator[0x14])(pFVar9,local_1e0);
            io::Printer::Outdent(format.printer_);
            Formatter::operator()<>(&format,"}\n");
          }
        }
      }
      else {
        RequiredFieldsBitMask(&masks_for_has_bits,this);
        stringpiece_internal::StringPiece::StringPiece((StringPiece *)local_70,"_has_bits_");
        has_bits_var.length_ = in_R9;
        has_bits_var.ptr_ = &local_68->variable_delimiter_;
        (anonymous_namespace)::ConditionalToCheckBitmasks_abi_cxx11_
                  ((string *)&cold_skipper,(_anonymous_namespace_ *)&masks_for_has_bits,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1,local_70[0],
                   has_bits_var);
        Formatter::operator()
                  (&format,"if ($1$) {  // All required fields are present.\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cold_skipper);
        std::__cxx11::string::~string((string *)&cold_skipper);
        io::Printer::Indent(format.printer_);
        ppFVar2 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        in_R8 = local_68;
        for (ppFVar14 = (this->optimized_order_).
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppFVar14 != ppFVar2;
            ppFVar14 = ppFVar14 + 1) {
          pFVar15 = *ppFVar14;
          if (((byte)pFVar15[1] & 0x60) == 0x40) {
            PrintFieldComment<google::protobuf::FieldDescriptor>(&format,pFVar15);
            pFVar9 = FieldGeneratorMap::get(&this->field_generators_,pFVar15);
            (*pFVar9->_vptr_FieldGenerator[0x14])(pFVar9,local_1e0);
            Formatter::operator()<>(&format,"\n");
          }
        }
        io::Printer::Outdent(format.printer_);
        Formatter::operator()<>
                  (&format,"} else {\n  total_size += RequiredFieldsByteSizeFallback();\n}\n");
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&masks_for_has_bits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      }
      chunks.
      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      chunks.
      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      chunks.
      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ppFVar2 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppFVar14 = (this->optimized_order_).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppFVar14 != ppFVar2;
          ppFVar14 = ppFVar14 + 1) {
        pFVar15 = *ppFVar14;
        cold_skipper.chunks_ =
             (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              *)pFVar15;
        if ((chunks.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             chunks.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           (field = chunks.
                    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1],
           (((byte)pFVar15[1] ^ (byte)field[1]) & 0x60) != 0)) {
LAB_002db638:
          std::
          vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ::emplace_back<>(&chunks);
        }
        else {
          iVar6 = HasByteIndex(this,field);
          iVar7 = HasByteIndex(this,pFVar15);
          if (iVar6 != iVar7) goto LAB_002db638;
        }
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back(chunks.
                    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1,(value_type *)&cold_skipper);
      }
      __first = std::
                __remove_if<__gnu_cxx::__normal_iterator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>*,std::vector<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,std::allocator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>>>,__gnu_cxx::__ops::_Iter_pred<bool(*)(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&)>>
                          ((__normal_iterator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_*,_std::vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>_>
                            )chunks.
                             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_*,_std::vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>_>
                            )chunks.
                             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                           (_Iter_pred<bool_(*)(const_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_&)>
                            )0x2e03bb);
      std::
      vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ::erase(&chunks,(const_iterator)__first._M_current,
              (const_iterator)
              chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
      printer_00 = local_1e0;
      fields = &this->has_bit_indices_;
      anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
                (&cold_skipper,options,&chunks,fields,
                 (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      cached_has_word_index = -1;
      Formatter::operator()<>
                (&format,
                 "$uint32$ cached_has_bits = 0;\n// Prevent compiler warnings about cached_has_bits being unused\n(void) cached_has_bits;\n\n"
                );
      uVar11 = 0;
      while( true ) {
        pvVar4 = chunks.
                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)chunks.
                           super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)chunks.
                          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar11) break;
        ppFVar14 = chunks.
                   super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11].
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        from = (string *)
               ((long)chunks.
                      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar11].
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar14);
        if (from < (string *)0x9) {
          local_1d4 = 0;
        }
        else {
          iVar6 = HasWordIndex(this,*ppFVar14);
          local_1d4 = CONCAT31((int3)((uint)iVar6 >> 8),iVar6 != -1);
        }
        std::__cxx11::string::string((string *)&masks_for_has_bits,"",(allocator *)&chunk_mask_str);
        anon_unknown_0::ColdChunkSkipper::OnStartChunk
                  (&cold_skipper,(int)printer_00,cached_has_word_index_00,from,in_R8);
        this_02 = (anon_unknown_0 *)(pvVar4 + uVar11);
        std::__cxx11::string::~string((string *)&masks_for_has_bits);
        if ((char)local_1d4 != '\0') {
          n = anon_unknown_0::GenChunkMask
                        (this_02,(vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  *)fields,has_bit_indices);
          hex.value = (ulong)n;
          hex._8_8_ = 8;
          strings::AlphaNum::AlphaNum((AlphaNum *)&masks_for_has_bits,hex);
          StrCat_abi_cxx11_(&chunk_mask_str,(protobuf *)&masks_for_has_bits,a);
          uVar8 = anon_unknown_0::popcnt(n);
          if ((int)uVar8 < 2) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&masks_for_has_bits,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0x1127);
            pLVar10 = internal::LogMessage::operator<<
                                ((LogMessage *)&masks_for_has_bits,
                                 "CHECK failed: (2) <= (popcnt(chunk_mask)): ");
            internal::LogFinisher::operator=((LogFinisher *)&__end3,pLVar10);
LAB_002db832:
            internal::LogMessage::~LogMessage((LogMessage *)&masks_for_has_bits);
          }
          else if (8 < uVar8) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&masks_for_has_bits,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0x1128);
            pLVar10 = internal::LogMessage::operator<<
                                ((LogMessage *)&masks_for_has_bits,
                                 "CHECK failed: (8) >= (popcnt(chunk_mask)): ");
            internal::LogFinisher::operator=((LogFinisher *)&__end3,pLVar10);
            goto LAB_002db832;
          }
          iVar6 = cached_has_word_index;
          iVar7 = HasWordIndex(this,(FieldDescriptor *)**(undefined8 **)this_02);
          if (iVar6 != iVar7) {
            cached_has_word_index = HasWordIndex(this,(FieldDescriptor *)**(undefined8 **)this_02);
            Formatter::operator()
                      (&format,"cached_has_bits = _has_bits_[$1$];\n",&cached_has_word_index);
          }
          Formatter::operator()(&format,"if (cached_has_bits & 0x$1$u) {\n",&chunk_mask_str);
          io::Printer::Indent(format.printer_);
          std::__cxx11::string::~string((string *)&chunk_mask_str);
        }
        for (uVar13 = 0; uVar13 < (ulong)(*(long *)(this_02 + 8) - *(long *)this_02 >> 3);
            uVar13 = uVar13 + 1) {
          pFVar15 = *(FieldDescriptor **)(*(long *)this_02 + uVar13 * 8);
          pFVar9 = FieldGeneratorMap::get(&this->field_generators_,pFVar15);
          PrintFieldComment<google::protobuf::FieldDescriptor>(&format,pFVar15);
          FVar1 = pFVar15[1];
          if (((byte)FVar1 & 0x60) == 0x60) {
            bVar5 = false;
          }
          else {
            bVar5 = HasHasbit(pFVar15);
            if (bVar5) {
              bVar5 = true;
              anon_unknown_0::PrintPresenceCheck
                        (&format,pFVar15,fields,(Printer *)&cached_has_word_index,(int *)in_R8);
            }
            else {
              std::__cxx11::string::string
                        ((string *)&masks_for_has_bits,"this->",(allocator *)&chunk_mask_str);
              bVar5 = anon_unknown_0::EmitFieldNonDefaultCondition
                                (local_1e0,(string *)&masks_for_has_bits,pFVar15);
              std::__cxx11::string::~string((string *)&masks_for_has_bits);
            }
          }
          (*pFVar9->_vptr_FieldGenerator[0x14])(pFVar9,local_1e0);
          if (bVar5 != false) {
            io::Printer::Outdent(format.printer_);
            Formatter::operator()<>(&format,"}\n\n");
          }
          if (((byte)FVar1 & 0x60) == 0x60) {
            Formatter::operator()<>(&format,"\n");
          }
          printer_00 = local_1e0;
        }
        if ((char)local_1d4 != '\0') {
          io::Printer::Outdent(format.printer_);
          Formatter::operator()<>(&format,"}\n");
        }
        bVar5 = anon_unknown_0::ColdChunkSkipper::OnEndChunk(&cold_skipper,(int)uVar11,printer_00);
        if (bVar5) {
          cached_has_word_index = -1;
        }
        uVar11 = uVar11 + 1;
      }
      chunk_mask_str._M_string_length = (size_type)this->descriptor_;
      chunk_mask_str._M_dataplus._M_p._0_4_ = 0;
      __end3.idx = *(int *)(chunk_mask_str._M_string_length + 0x6c);
      __end3.descriptor = (Descriptor *)chunk_mask_str._M_string_length;
      while( true ) {
        bVar5 = operator!=((Iterator *)&chunk_mask_str,&__end3);
        if (!bVar5) break;
        lVar12 = (long)(int)chunk_mask_str._M_dataplus._M_p;
        lVar3 = *(long *)(chunk_mask_str._M_string_length + 0x30);
        Formatter::operator()
                  (&format,"switch ($1$_case()) {\n",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar3 + 8 + lVar12 * 0x28));
        io::Printer::Indent(format.printer_);
        local_1e0 = (Printer *)(lVar3 + lVar12 * 0x28);
        __begin4.idx = 0;
        __end4.idx = *(int *)&local_1e0->field_0x4;
        __begin4.descriptor = (OneofDescriptor *)local_1e0;
        __end4.descriptor = (OneofDescriptor *)local_1e0;
        while( true ) {
          bVar5 = operator!=(&__begin4,&__end4);
          if (!bVar5) break;
          pFVar15 = (FieldDescriptor *)
                    ((long)__begin4.idx * 0x48 + *(long *)(__begin4.descriptor + 0x20));
          PrintFieldComment<google::protobuf::FieldDescriptor>(&format,pFVar15);
          UnderscoresToCamelCase((string *)&masks_for_has_bits,*(string **)(pFVar15 + 8),true);
          Formatter::operator()(&format,"case k$1$: {\n",(string *)&masks_for_has_bits);
          std::__cxx11::string::~string((string *)&masks_for_has_bits);
          io::Printer::Indent(format.printer_);
          pFVar9 = FieldGeneratorMap::get(&this->field_generators_,pFVar15);
          (*pFVar9->_vptr_FieldGenerator[0x14])(pFVar9,printer_00);
          Formatter::operator()<>(&format,"break;\n");
          io::Printer::Outdent(format.printer_);
          Formatter::operator()<>(&format,"}\n");
          __begin4.idx = __begin4.idx + 1;
        }
        ToUpper((string *)&masks_for_has_bits,(string *)local_1e0->output_);
        Formatter::operator()
                  (&format,"case $1$_NOT_SET: {\n  break;\n}\n",(string *)&masks_for_has_bits);
        std::__cxx11::string::~string((string *)&masks_for_has_bits);
        io::Printer::Outdent(format.printer_);
        Formatter::operator()<>(&format,"}\n");
        chunk_mask_str._M_dataplus._M_p._0_4_ = (int)chunk_mask_str._M_dataplus._M_p + 1;
      }
      if (this->num_weak_fields_ != 0) {
        Formatter::operator()<>(&format,"total_size += _weak_field_map_.ByteSizeLong();\n");
      }
      bVar5 = UseUnknownFieldSet(*(FileDescriptor **)(this->descriptor_ + 0x10),options);
      if (bVar5) {
        format_00 = "return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);\n";
      }
      else {
        Formatter::operator()<>(&format,"if (PROTOBUF_PREDICT_FALSE($have_unknown_fields$)) {\n");
        Formatter::operator()<>(&format,"  total_size += $unknown_fields$.size();\n");
        Formatter::operator()<>(&format,"}\n");
        format_00 = 
        "int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\nSetCachedSize(cached_size);\nreturn total_size;\n"
        ;
      }
      Formatter::operator()<>(&format,format_00);
      io::Printer::Outdent(format.printer_);
      Formatter::operator()<>(&format,"}\n");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&cold_skipper.variables_._M_t);
      std::
      vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ::~vector(&chunks);
      this_01 = (ColdChunkSkipper *)&vars;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)this_01);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&format.vars_._M_t);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateByteSize(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    std::map<std::string, std::string> vars;
    SetUnknownFieldsVariable(descriptor_, options_, &vars);
    format.AddMap(vars);
    format(
        "size_t $classname$::ByteSizeLong() const {\n"
        "$annotate_bytesize$"
        "// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n"
        "  size_t total_size = _extensions_.MessageSetByteSize();\n"
        "  if ($have_unknown_fields$) {\n"
        "    total_size += ::$proto_ns$::internal::\n"
        "        ComputeUnknownMessageSetItemsSize($unknown_fields$);\n"
        "  }\n"
        "  int cached_size = "
        "::$proto_ns$::internal::ToCachedSize(total_size);\n"
        "  SetCachedSize(cached_size);\n"
        "  return total_size;\n"
        "}\n");
    return;
  }

  if (num_required_fields_ > 1) {
    // Emit a function (rarely used, we hope) that handles the required fields
    // by checking for each one individually.
    format(
        "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n"
        "// @@protoc_insertion_point(required_fields_byte_size_fallback_start:"
        "$full_name$)\n");
    format.Indent();
    format("size_t total_size = 0;\n");
    for (auto field : optimized_order_) {
      if (field->is_required()) {
        format(
            "\n"
            "if (_internal_has_$1$()) {\n",
            FieldName(field));
        format.Indent();
        PrintFieldComment(format, field);
        field_generators_.get(field).GenerateByteSize(printer);
        format.Outdent();
        format("}\n");
      }
    }
    format(
        "\n"
        "return total_size;\n");
    format.Outdent();
    format("}\n");
  }

  format(
      "size_t $classname$::ByteSizeLong() const {\n"
      "$annotate_bytesize$"
      "// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n");
  format.Indent();
  format(
      "size_t total_size = 0;\n"
      "\n");

  if (descriptor_->extension_range_count() > 0) {
    format(
        "total_size += _extensions_.ByteSize();\n"
        "\n");
  }

  std::map<std::string, std::string> vars;
  SetUnknownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);

  // Handle required fields (if any).  We expect all of them to be
  // present, so emit one conditional that checks for that.  If they are all
  // present then the fast path executes; otherwise the slow path executes.
  if (num_required_fields_ > 1) {
    // The fast path works if all required fields are present.
    const std::vector<uint32_t> masks_for_has_bits = RequiredFieldsBitMask();
    format("if ($1$) {  // All required fields are present.\n",
           ConditionalToCheckBitmasks(masks_for_has_bits));
    format.Indent();
    // Oneof fields cannot be required, so optimized_order_ contains all of the
    // fields that we need to potentially emit.
    for (auto field : optimized_order_) {
      if (!field->is_required()) continue;
      PrintFieldComment(format, field);
      field_generators_.get(field).GenerateByteSize(printer);
      format("\n");
    }
    format.Outdent();
    format(
        "} else {\n"  // the slow path
        "  total_size += RequiredFieldsByteSizeFallback();\n"
        "}\n");
  } else {
    // num_required_fields_ <= 1: no need to be tricky
    for (auto field : optimized_order_) {
      if (!field->is_required()) continue;
      PrintFieldComment(format, field);
      format("if (_internal_has_$1$()) {\n", FieldName(field));
      format.Indent();
      field_generators_.get(field).GenerateByteSize(printer);
      format.Outdent();
      format("}\n");
    }
  }

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return a->label() == b->label() && HasByteIndex(a) == HasByteIndex(b);
      });

  // Remove chunks with required fields.
  chunks.erase(std::remove_if(chunks.begin(), chunks.end(), IsRequired),
               chunks.end());

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);
  int cached_has_word_index = -1;

  format(
      "$uint32$ cached_has_bits = 0;\n"
      "// Prevent compiler warnings about cached_has_bits being unused\n"
      "(void) cached_has_bits;\n\n");

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    const std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    const bool have_outer_if =
        chunk.size() > 1 && HasWordIndex(chunk[0]) != kNoHasbit;
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "", printer);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32_t chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = _has_bits_[$1$];\n", cached_has_word_index);
      }
      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    // Go back and emit checks for each of the fields we processed.
    for (int j = 0; j < chunk.size(); j++) {
      const FieldDescriptor* field = chunk[j];
      const FieldGenerator& generator = field_generators_.get(field);
      bool have_enclosing_if = false;
      bool need_extra_newline = false;

      PrintFieldComment(format, field);

      if (field->is_repeated()) {
        // No presence check is required.
        need_extra_newline = true;
      } else if (HasHasbit(field)) {
        PrintPresenceCheck(format, field, has_bit_indices_, printer,
                           &cached_has_word_index);
        have_enclosing_if = true;
      } else {
        // Without field presence: field is serialized only if it has a
        // non-default value.
        have_enclosing_if =
            EmitFieldNonDefaultCondition(printer, "this->", field);
      }

      generator.GenerateByteSize(printer);

      if (have_enclosing_if) {
        format.Outdent();
        format(
            "}\n"
            "\n");
      }
      if (need_extra_newline) {
        format("\n");
      }
    }

    if (have_outer_if) {
      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Fields inside a oneof don't use _has_bits_ so we count them in a separate
  // pass.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("switch ($1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      PrintFieldComment(format, field);
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (!IsFieldStripped(field, options_)) {
        field_generators_.get(field).GenerateByteSize(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }

  if (num_weak_fields_) {
    // TagSize + MessageSize
    format("total_size += _weak_field_map_.ByteSizeLong();\n");
  }

  if (UseUnknownFieldSet(descriptor_->file(), options_)) {
    // We go out of our way to put the computation of the uncommon path of
    // unknown fields in tail position. This allows for better code generation
    // of this function for simple protos.
    format(
        "return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);\n");
  } else {
    format("if (PROTOBUF_PREDICT_FALSE($have_unknown_fields$)) {\n");
    format("  total_size += $unknown_fields$.size();\n");
    format("}\n");

    // We update _cached_size_ even though this is a const method.  Because
    // const methods might be called concurrently this needs to be atomic
    // operations or the program is undefined.  In practice, since any
    // concurrent writes will be writing the exact same value, normal writes
    // will work on all common processors. We use a dedicated wrapper class to
    // abstract away the underlying atomic. This makes it easier on platforms
    // where even relaxed memory order might have perf impact to replace it with
    // ordinary loads and stores.
    format(
        "int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\n"
        "SetCachedSize(cached_size);\n"
        "return total_size;\n");
  }

  format.Outdent();
  format("}\n");
}